

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_find.c
# Opt level: O0

s_linkedlist * linkedlist_find(s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg)

{
  e_matcher_result eVar1;
  s_linkedlist *linked_list_result;
  s_linkedlist_node *node;
  void *matcher_arg_local;
  f_matcher matcher_local;
  s_linkedlist *linked_list_local;
  
  linked_list_result = (s_linkedlist *)linked_list->head;
  linked_list_local = linkedlist_create();
  if (linked_list_local == (s_linkedlist *)0x0) {
    linked_list_local = (s_linkedlist *)0x0;
  }
  else {
    for (; linked_list_result != (s_linkedlist *)0x0;
        linked_list_result = (s_linkedlist *)linked_list_result->head) {
      eVar1 = (*matcher)(linked_list_result->tail,matcher_arg);
      if (eVar1 == E_MATCHER_RESULT_MATCH) {
        linkedlist_add_back(linked_list_local,linked_list_result->tail);
      }
    }
  }
  return linked_list_local;
}

Assistant:

s_linkedlist *linkedlist_find(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg) {
    s_linkedlist_node *node               = linked_list->head;
    s_linkedlist      *linked_list_result = linkedlist_create();

    if (linked_list_result == NULL) {
        return NULL;
    }

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            linkedlist_add_back(linked_list_result, node->element);
        }

        node = node->next;
    }

    return linked_list_result;
}